

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderModule.cpp
# Opt level: O2

Ptr<ShaderModule> __thiscall
myvk::ShaderModule::Create(ShaderModule *this,Ptr<Device> *device,uint32_t *code,uint32_t code_size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  VkResult VVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<ShaderModule> PVar3;
  shared_ptr<myvk::ShaderModule> ret;
  _func_int **local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  VkShaderModuleCreateInfo local_58;
  
  std::make_shared<myvk::ShaderModule>();
  std::__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 3),
             &device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>);
  local_58.pNext = (void *)0x0;
  local_58.flags = 0;
  local_58._20_4_ = 0;
  local_58.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  local_58._4_4_ = 0;
  local_58.codeSize = (size_t)code_size;
  local_58.pCode = code;
  VVar2 = (*vkCreateShaderModule)
                    (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->m_device,&local_58,(VkAllocationCallbacks *)0x0,
                     (VkShaderModule *)(local_68 + 5));
  _Var1._M_pi = _Stack_60._M_pi;
  if (VVar2 == VK_SUCCESS) {
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_68;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  PVar3.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ShaderModule>)PVar3.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ptr<ShaderModule> ShaderModule::Create(const Ptr<Device> &device, const uint32_t *code, uint32_t code_size) {
	auto ret = std::make_shared<ShaderModule>();
	ret->m_device_ptr = device;

	VkShaderModuleCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
	info.pCode = code;
	info.codeSize = code_size;
	if (vkCreateShaderModule(device->GetHandle(), &info, nullptr, &ret->m_shader_module) != VK_SUCCESS)
		return nullptr;
	return ret;
}